

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_16x16(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  JSAMPLE *pJVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  int workspace [128];
  int local_238 [130];
  
  pJVar4 = cinfo->sample_range_limit;
  pvVar5 = compptr->dct_table;
  lVar22 = 0;
  do {
    lVar9 = (long)*(short *)((long)pvVar5 + lVar22 * 2) * (long)coef_block[lVar22] * 0x2000;
    lVar14 = (long)*(short *)((long)pvVar5 + lVar22 * 2 + 0x40) * (long)coef_block[lVar22 + 0x20];
    lVar34 = lVar14 * 0x29cf + lVar9 + 0x400;
    lVar39 = lVar9 + 0x400 + lVar14 * -0x29cf;
    lVar47 = lVar14 * 0x1151 + lVar9 + 0x400;
    lVar50 = lVar9 + 0x400 + lVar14 * -0x1151;
    lVar9 = (long)*(short *)((long)pvVar5 + lVar22 * 2 + 0x20) * (long)coef_block[lVar22 + 0x10];
    lVar14 = (long)*(short *)((long)pvVar5 + lVar22 * 2 + 0x60) * (long)coef_block[lVar22 + 0x30];
    lVar26 = (lVar9 - lVar14) * 0x8d4;
    lVar10 = (lVar9 - lVar14) * 0x2c63;
    lVar30 = lVar14 * 0x5203 + lVar10;
    lVar7 = lVar9 * 0x1ccd + lVar26;
    lVar10 = lVar9 * -0x133e + lVar10;
    lVar26 = lVar14 * -0x1050 + lVar26;
    lVar9 = lVar30 + lVar34;
    lVar34 = lVar34 - lVar30;
    lVar14 = lVar7 + lVar47;
    lVar47 = lVar47 - lVar7;
    lVar7 = lVar10 + lVar50;
    lVar50 = lVar50 - lVar10;
    lVar10 = lVar26 + lVar39;
    lVar39 = lVar39 - lVar26;
    lVar27 = (long)*(short *)((long)pvVar5 + lVar22 * 2 + 0x10) * (long)coef_block[lVar22 + 8];
    lVar26 = (long)*(short *)((long)pvVar5 + lVar22 * 2 + 0x30) * (long)coef_block[lVar22 + 0x18];
    lVar35 = (long)*(short *)((long)pvVar5 + lVar22 * 2 + 0x50) * (long)coef_block[lVar22 + 0x28];
    lVar11 = (long)*(short *)((long)pvVar5 + lVar22 * 2 + 0x70) * (long)coef_block[lVar22 + 0x38];
    lVar30 = (lVar26 + lVar27) * 0x2b4e;
    lVar19 = (lVar11 + lVar27) * 0x22fc;
    lVar40 = (lVar35 + lVar27) * 0x27e9;
    lVar51 = lVar27 * -0x492a + lVar30 + lVar40 + lVar19;
    lVar17 = (lVar27 - lVar11) * 0x1cb6;
    lVar42 = (lVar35 + lVar27) * 0x1555;
    lVar48 = (lVar27 - lVar26) * 0xd23;
    lVar20 = lVar27 * -0x3abe + lVar48 + lVar42 + lVar17;
    lVar28 = (lVar35 + lVar26) * 0x470;
    lVar27 = (lVar26 + lVar11) * -0x1555;
    lVar29 = lVar28 + lVar27 + lVar26 * 0x24d + lVar30;
    lVar49 = (lVar35 - lVar26) * 0x2d09;
    lVar30 = (lVar26 + lVar11) * -0x27e9;
    lVar48 = lVar49 + lVar30 + lVar26 * 0x3f1a + lVar48;
    lVar26 = (lVar11 + lVar35) * -0x2b4e;
    lVar28 = lVar40 + lVar26 + lVar35 * -0x2406 + lVar28;
    lVar27 = lVar19 + lVar26 + lVar11 * 0x2218 + lVar27;
    lVar26 = (lVar11 - lVar35) * 0xd23;
    lVar30 = lVar17 + lVar26 + lVar11 * 0x6485 + lVar30;
    lVar26 = lVar42 + lVar26 + lVar35 * -0x1886 + lVar49;
    local_238[lVar22] = (int)((ulong)(lVar51 + lVar9) >> 0xb);
    local_238[lVar22 + 0x78] = (int)((ulong)(lVar9 - lVar51) >> 0xb);
    local_238[lVar22 + 8] = (int)((ulong)(lVar29 + lVar14) >> 0xb);
    local_238[lVar22 + 0x70] = (int)((ulong)(lVar14 - lVar29) >> 0xb);
    local_238[lVar22 + 0x10] = (int)((ulong)(lVar28 + lVar7) >> 0xb);
    local_238[lVar22 + 0x68] = (int)((ulong)(lVar7 - lVar28) >> 0xb);
    local_238[lVar22 + 0x18] = (int)((ulong)(lVar27 + lVar10) >> 0xb);
    local_238[lVar22 + 0x60] = (int)((ulong)(lVar10 - lVar27) >> 0xb);
    local_238[lVar22 + 0x20] = (int)((ulong)(lVar39 + lVar30) >> 0xb);
    local_238[lVar22 + 0x58] = (int)((ulong)(lVar39 - lVar30) >> 0xb);
    local_238[lVar22 + 0x28] = (int)((ulong)(lVar50 + lVar26) >> 0xb);
    local_238[lVar22 + 0x50] = (int)((ulong)(lVar50 - lVar26) >> 0xb);
    local_238[lVar22 + 0x30] = (int)((ulong)(lVar48 + lVar47) >> 0xb);
    local_238[lVar22 + 0x48] = (int)((ulong)(lVar47 - lVar48) >> 0xb);
    local_238[lVar22 + 0x38] = (int)((ulong)(lVar20 + lVar34) >> 0xb);
    local_238[lVar22 + 0x40] = (int)((ulong)(lVar34 - lVar20) >> 0xb);
    lVar22 = lVar22 + 1;
  } while ((int)lVar22 != 8);
  uVar8 = (ulong)output_col;
  lVar22 = 0;
  do {
    iVar6 = local_238[lVar22 + 1];
    iVar31 = local_238[lVar22] * 0x2000;
    iVar1 = local_238[lVar22 + 4];
    iVar15 = iVar31 + iVar1 * 0x29cf + 0x20000;
    iVar43 = iVar31 + iVar1 * 0x1151 + 0x20000;
    iVar2 = local_238[lVar22 + 2];
    iVar3 = local_238[lVar22 + 6];
    iVar41 = iVar31 + 0x20000 + iVar1 * -0x1151;
    iVar18 = (iVar2 - iVar3) * 0x8d4;
    iVar23 = (iVar2 - iVar3) * 0x2c63;
    iVar36 = iVar3 * 0x5203 + iVar23;
    iVar12 = iVar2 * 0x1ccd + iVar18;
    iVar23 = iVar2 * -0x133e + iVar23;
    iVar32 = iVar31 + 0x20000 + iVar1 * -0x29cf;
    iVar18 = iVar3 * -0x1050 + iVar18;
    iVar1 = iVar36 + iVar15;
    iVar31 = local_238[lVar22 + 3];
    iVar15 = iVar15 - iVar36;
    iVar36 = local_238[lVar22 + 5];
    iVar21 = local_238[lVar22 + 7];
    iVar2 = iVar12 + iVar43;
    iVar44 = (iVar31 + iVar6) * 0x2b4e;
    iVar16 = (iVar21 + iVar6) * 0x22fc;
    iVar43 = iVar43 - iVar12;
    iVar33 = (iVar36 + iVar6) * 0x27e9;
    iVar38 = iVar6 * -0x492a + iVar44 + iVar33 + iVar16;
    iVar3 = iVar23 + iVar41;
    iVar41 = iVar41 - iVar23;
    iVar37 = (iVar6 - iVar21) * 0x1cb6;
    iVar23 = (iVar36 + iVar6) * 0x1555;
    iVar24 = (iVar6 - iVar31) * 0xd23;
    iVar13 = iVar6 * -0x3abe + iVar24 + iVar23 + iVar37;
    iVar45 = (iVar36 + iVar31) * 0x470;
    iVar6 = (iVar31 + iVar21) * -0x1555;
    iVar46 = iVar45 + iVar6 + iVar31 * 0x24d + iVar44;
    iVar25 = (iVar36 - iVar31) * 0x2d09;
    iVar12 = (iVar31 + iVar21) * -0x27e9;
    iVar44 = (iVar21 + iVar36) * -0x2b4e;
    iVar33 = iVar33 + iVar44 + iVar36 * -0x2406 + iVar45;
    iVar24 = iVar25 + iVar12 + iVar31 * 0x3f1a + iVar24;
    iVar31 = iVar16 + iVar44 + iVar21 * 0x2218 + iVar6;
    iVar6 = (iVar21 - iVar36) * 0xd23;
    iVar12 = iVar37 + iVar6 + iVar21 * 0x6485 + iVar12;
    iVar21 = iVar18 + iVar32;
    iVar32 = iVar32 - iVar18;
    iVar6 = iVar23 + iVar6 + iVar36 * -0x1886 + iVar25;
    lVar9 = *(long *)((long)output_buf + lVar22);
    *(JSAMPLE *)(lVar9 + uVar8) = pJVar4[(ulong)((uint)(iVar38 + iVar1) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 0xf + uVar8) =
         pJVar4[(ulong)((uint)(iVar1 - iVar38) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 1 + uVar8) = pJVar4[(ulong)((uint)(iVar46 + iVar2) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar9 + 0xe + uVar8) =
         pJVar4[(ulong)((uint)(iVar2 - iVar46) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 2 + uVar8) = pJVar4[(ulong)((uint)(iVar33 + iVar3) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar9 + 0xd + uVar8) =
         pJVar4[(ulong)((uint)(iVar3 - iVar33) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 3 + uVar8) =
         pJVar4[(ulong)((uint)(iVar21 + iVar31) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 0xc + uVar8) =
         pJVar4[(ulong)((uint)(iVar21 - iVar31) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 4 + uVar8) =
         pJVar4[(ulong)((uint)(iVar12 + iVar32) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 0xb + uVar8) =
         pJVar4[(ulong)((uint)(iVar32 - iVar12) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 5 + uVar8) = pJVar4[(ulong)((uint)(iVar6 + iVar41) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar9 + 10 + uVar8) =
         pJVar4[(ulong)((uint)(iVar41 - iVar6) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 6 + uVar8) =
         pJVar4[(ulong)((uint)(iVar24 + iVar43) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 9 + uVar8) =
         pJVar4[(ulong)((uint)(iVar43 - iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 7 + uVar8) =
         pJVar4[(ulong)((uint)(iVar13 + iVar15) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 8 + uVar8) =
         pJVar4[(ulong)((uint)(iVar15 - iVar13) >> 0x12 & 0x3ff) + 0x80];
    lVar22 = lVar22 + 8;
  } while (lVar22 != 0x80);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_16x16(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 16];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
            MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
            MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, -FIX(0.666655658));       /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, -FIX(1.247225013));       /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, -FIX(1.353318001));  /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp0,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 15] = (int)RIGHT_SHIFT(tmp20 - tmp0,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp1,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 14] = (int)RIGHT_SHIFT(tmp21 - tmp1,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp2,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 13] = (int)RIGHT_SHIFT(tmp22 - tmp2,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp3,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp23 - tmp3,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp24 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp25 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp26 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp27 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp27 - tmp13, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 16 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 16; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);

    z1 = (JLONG)wsptr[4];
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[6];
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
            MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
            MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, -FIX(0.666655658));       /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, -FIX(1.247225013));       /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, -FIX(1.353318001));  /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp0,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[15] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp0,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp1,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[14] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp1,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp2,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[13] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp2,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp3,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp3,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp26 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp27 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp27 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}